

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

undefined8 __thiscall
bgui::ImageAdapter<unsigned_char>::getDescriptionOfPixel_abi_cxx11_
          (ImageAdapter<unsigned_char> *this,long x,long y)

{
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  long i;
  int iVar1;
  work_t wVar2;
  long *plVar3;
  ostream *poVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int d;
  SVector<long,_2> p;
  ostringstream os;
  SVector<long,_3> *in_stack_fffffffffffffe00;
  SMatrix<long,_2,_3> *in_stack_fffffffffffffe08;
  int local_1d0;
  SVector<long,_3> local_1c0;
  SVector<long,_2> local_1a8;
  long local_198 [47];
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  local_18 = (long)((double)local_18 / *(double *)(in_RSI + 0x48));
  local_20 = (long)((double)local_20 / *(double *)(in_RSI + 0x48));
  gmath::SVector<long,_3>::SVector(&local_1c0,local_18,local_20,1);
  gmath::SMatrix<long,_2,_3>::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator<<((ostream *)local_198,"x=");
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
  plVar3 = gmath::SVector<long,_2>::operator[](&local_1a8,0);
  poVar4 = (ostream *)std::ostream::operator<<(local_198,*plVar3);
  std::operator<<(poVar4,", y=");
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
  plVar3 = gmath::SVector<long,_2>::operator[](&local_1a8,1);
  poVar4 = (ostream *)std::ostream::operator<<(local_198,*plVar3);
  std::operator<<(poVar4,":");
  local_1d0 = 0;
  while( true ) {
    iVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RSI + 0x70));
    if (iVar1 <= local_1d0) break;
    std::operator<<((ostream *)local_198," ");
    std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
    this_00 = *(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)(in_RSI + 0x70);
    plVar3 = gmath::SVector<long,_2>::operator[](&local_1a8,0);
    i = *plVar3;
    plVar3 = gmath::SVector<long,_2>::operator[](&local_1a8,1);
    wVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getW
                      (this_00,i,*plVar3,local_1d0);
    std::ostream::operator<<(local_198,wVar2);
    local_1d0 = local_1d0 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string getDescriptionOfPixel(long x, long y) const
    {
      std::ostringstream os;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      os << "x=";

      os.width(5);
      os << p[0] << ", y=";

      os.width(5);
      os << p[1] << ":";

      for (int d=0; d<image->getDepth(); d++)
      {
        os << " ";

        os.width(5);
        os << image->getW(p[0], p[1], d);
      }

      return os.str();
    }